

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.h
# Opt level: O0

void __thiscall arangodb::velocypack::Builder::addDouble(Builder *this,double v)

{
  Builder *in_RDI;
  uint64_t x;
  ValueLength vSize;
  uint64_t dv;
  uint8_t in_stack_ffffffffffffffcf;
  ValueLength in_stack_ffffffffffffffd8;
  Builder *this_00;
  undefined1 local_18 [8];
  undefined1 local_10 [16];
  
  this_00 = (Builder *)0x8;
  memcpy(local_18,local_10,8);
  reserve(this_00,in_stack_ffffffffffffffd8);
  appendByteUnchecked(in_RDI,in_stack_ffffffffffffffcf);
  for (; this_00 != (Builder *)0x0; this_00 = (Builder *)((long)&this_00[-1].options + 7)) {
    appendByteUnchecked(in_RDI,in_stack_ffffffffffffffcf);
  }
  return;
}

Assistant:

void addDouble(double v) {
    uint64_t dv;
    ValueLength vSize = sizeof(double);
    memcpy(&dv, &v, vSize);
    reserve(1 + vSize);
    appendByteUnchecked(0x1b);
    for (uint64_t x = dv; vSize > 0; vSize--) {
      appendByteUnchecked(x & 0xff);
      x >>= 8;
    }
  }